

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerators::Run(cmQtAutoGenerators *this,string *targetDirectory,string *config)

{
  Snapshot snapshot;
  byte bVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  PositionType local_890;
  Snapshot local_880;
  cmLocalGenerator *local_868;
  cmLocalGenerator *lg;
  cmGlobalGenerator gg;
  undefined1 local_288 [8];
  cmake cm;
  bool success;
  string *config_local;
  string *targetDirectory_local;
  cmQtAutoGenerators *this_local;
  
  cm.CurrentSnapshot.Position.Position._7_1_ = 1;
  cmake::cmake((cmake *)local_288);
  cmake::SetHomeOutputDirectory((cmake *)local_288,targetDirectory);
  cmake::SetHomeDirectory((cmake *)local_288,targetDirectory);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&lg,(cmake *)local_288);
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_890);
  cmState::Snapshot::Snapshot(&local_880,(cmState *)0x0,local_890);
  snapshot.Position.Tree = local_880.Position.Tree;
  snapshot.State = local_880.State;
  snapshot.Position.Position = local_880.Position.Position;
  local_868 = cmGlobalGenerator::MakeLocalGenerator
                        ((cmGlobalGenerator *)&lg,snapshot,(cmLocalGenerator *)0x0);
  pcVar3 = cmLocalGenerator::GetMakefile(local_868);
  cmMakefile::SetCurrentBinaryDirectory(pcVar3,targetDirectory);
  pcVar3 = cmLocalGenerator::GetMakefile(local_868);
  cmMakefile::SetCurrentSourceDirectory(pcVar3,targetDirectory);
  pcVar3 = cmLocalGenerator::GetMakefile(local_868);
  cmGlobalGenerator::SetCurrentMakefile((cmGlobalGenerator *)&lg,pcVar3);
  pcVar3 = cmLocalGenerator::GetMakefile(local_868);
  ReadAutogenInfoFile(this,pcVar3,targetDirectory,config);
  pcVar3 = cmLocalGenerator::GetMakefile(local_868);
  ReadOldMocDefinitionsFile(this,pcVar3,targetDirectory);
  Init(this);
  bVar2 = std::operator==(&this->QtMajorVersion,"4");
  if ((bVar2) || (bVar2 = std::operator==(&this->QtMajorVersion,"5"), bVar2)) {
    pcVar3 = cmLocalGenerator::GetMakefile(local_868);
    cm.CurrentSnapshot.Position.Position._7_1_ = RunAutogen(this,pcVar3);
  }
  WriteOldMocDefinitionsFile(this,targetDirectory);
  if (local_868 != (cmLocalGenerator *)0x0) {
    (*local_868->_vptr_cmLocalGenerator[1])();
  }
  bVar1 = cm.CurrentSnapshot.Position.Position._7_1_;
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&lg);
  cmake::~cmake((cmake *)local_288);
  return (bool)(bVar1 & 1);
}

Assistant:

bool cmQtAutoGenerators::Run(const std::string& targetDirectory,
                             const std::string& config)
{
  bool success = true;
  cmake cm;
  cm.SetHomeOutputDirectory(targetDirectory);
  cm.SetHomeDirectory(targetDirectory);
  cmGlobalGenerator gg(&cm);

  cmLocalGenerator* lg = gg.MakeLocalGenerator();
  lg->GetMakefile()->SetCurrentBinaryDirectory(targetDirectory);
  lg->GetMakefile()->SetCurrentSourceDirectory(targetDirectory);
  gg.SetCurrentMakefile(lg->GetMakefile());

  this->ReadAutogenInfoFile(lg->GetMakefile(), targetDirectory, config);
  this->ReadOldMocDefinitionsFile(lg->GetMakefile(), targetDirectory);

  this->Init();

  if (this->QtMajorVersion == "4" || this->QtMajorVersion == "5")
    {
    success = this->RunAutogen(lg->GetMakefile());
    }

  this->WriteOldMocDefinitionsFile(targetDirectory);

  delete lg;
  return success;
}